

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderDerivateTests::init(ShaderDerivateTests *this,EVP_PKEY_CTX *ctx)

{
  SurfaceType SVar1;
  int iVar2;
  deUint32 dVar3;
  TestContext *testCtx;
  Context *pCVar4;
  TestNode *pTVar5;
  char *pcVar6;
  char *pcVar7;
  TestNode *pTVar8;
  TestNode *pTVar9;
  ostream *poVar10;
  LinearDerivateCase *pLVar11;
  TextureDerivateCase *this_00;
  ShaderDerivateTests *pSVar12;
  DataType local_8fc;
  DataType local_8ac;
  DataType local_85c;
  DataType local_814;
  DataType local_7e4;
  string local_7a8 [32];
  undefined1 local_788 [8];
  ostringstream caseName_3;
  Precision precision_3;
  DataType dataType_4;
  int precNdx_3;
  int vecSize_4;
  deUint32 hint_3;
  int numSamples_3;
  SurfaceType surfaceType_3;
  TestCaseGroup *caseGroup;
  int texCaseNdx;
  TestCaseGroup *textureGroup;
  string local_5d0 [32];
  undefined1 local_5b0 [8];
  ostringstream caseName_2;
  Precision precision_2;
  DataType dataType_3;
  int precNdx_2;
  int vecSize_3;
  int numSamples_2;
  SurfaceType surfaceType_2;
  TestCaseGroup *fboGroup_1;
  int fboCaseNdx;
  deUint32 hint_2;
  char *source_2;
  TestCaseGroup *hintGroup;
  int hintCaseNdx;
  undefined1 local_3d8 [8];
  ostringstream caseName_1;
  deUint32 hint_1;
  Precision precision_1;
  DataType dataType_2;
  int precNdx_1;
  int vecSize_2;
  int numSamples_1;
  SurfaceType surfaceType_1;
  char *source_1;
  TestCaseGroup *fboGroup;
  int caseNdx_1;
  undefined4 local_204;
  undefined1 local_200 [8];
  ostringstream caseName;
  deUint32 hint;
  int numSamples;
  SurfaceType surfaceType;
  Precision precision;
  DataType dataType_1;
  int precNdx;
  int vecSize_1;
  char *source;
  TestCaseGroup *linearCaseGroup;
  int caseNdx;
  DataType dataType;
  int vecSize;
  TestCaseGroup *constantGroup;
  TestCaseGroup *functionGroup;
  DerivateFunc function;
  int funcNdx;
  ShaderDerivateTests *this_local;
  
  functionGroup._4_4_ = DERIVATE_DFDX;
  pSVar12 = this;
  while ((int)functionGroup._4_4_ < 3) {
    pTVar5 = (TestNode *)operator_new(0x70);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pcVar6 = getDerivateFuncCaseName(functionGroup._4_4_);
    pcVar7 = getDerivateFuncName(functionGroup._4_4_);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar5,testCtx,pcVar6,pcVar7);
    tcu::TestNode::addChild((TestNode *)this,pTVar5);
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"constant",
               "Derivate of constant argument");
    tcu::TestNode::addChild(pTVar5,pTVar8);
    for (caseNdx = 1; caseNdx < 5; caseNdx = caseNdx + 1) {
      if (caseNdx < 2) {
        local_7e4 = TYPE_FLOAT;
      }
      else {
        local_7e4 = glu::getDataTypeFloatVec(caseNdx);
      }
      pTVar9 = (TestNode *)operator_new(0xf8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      pcVar6 = glu::getDataTypeName(local_7e4);
      ConstantDerivateCase::ConstantDerivateCase
                ((ConstantDerivateCase *)pTVar9,pCVar4,pcVar6,"",functionGroup._4_4_,local_7e4);
      tcu::TestNode::addChild(pTVar8,pTVar9);
    }
    for (linearCaseGroup._4_4_ = 0; linearCaseGroup._4_4_ < 8;
        linearCaseGroup._4_4_ = linearCaseGroup._4_4_ + 1) {
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_linearDerivateCases[linearCaseGroup._4_4_].name,
                 init::s_linearDerivateCases[linearCaseGroup._4_4_].description);
      pcVar6 = init::s_linearDerivateCases[linearCaseGroup._4_4_].source;
      tcu::TestNode::addChild(pTVar5,pTVar8);
      for (dataType_1 = TYPE_FLOAT; (int)dataType_1 < 5; dataType_1 = dataType_1 + TYPE_FLOAT) {
        for (precision = PRECISION_LOWP; (int)precision < 3;
            precision = precision + PRECISION_MEDIUMP) {
          if ((int)dataType_1 < 2) {
            local_814 = TYPE_FLOAT;
          }
          else {
            local_814 = glu::getDataTypeFloatVec(dataType_1);
          }
          caseName._372_4_ = 0x1100;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
          if ((linearCaseGroup._4_4_ == 0) || (precision != PRECISION_LOWP)) {
            pcVar7 = glu::getDataTypeName(local_814);
            poVar10 = std::operator<<((ostream *)local_200,pcVar7);
            poVar10 = std::operator<<(poVar10,"_");
            pcVar7 = glu::getPrecisionName(precision);
            std::operator<<(poVar10,pcVar7);
            pLVar11 = (LinearDerivateCase *)operator_new(0x118);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::str();
            pcVar7 = (char *)std::__cxx11::string::c_str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar11,pCVar4,pcVar7,"",functionGroup._4_4_,local_814,precision,0x1100,
                       SURFACETYPE_DEFAULT_FRAMEBUFFER,0,pcVar6);
            tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
            std::__cxx11::string::~string((string *)&caseNdx_1);
            local_204 = 0;
          }
          else {
            local_204 = 0x10;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
        }
      }
    }
    for (fboGroup._0_4_ = 0; (int)fboGroup < 4; fboGroup._0_4_ = (int)fboGroup + 1) {
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_fboConfigs[(int)fboGroup].name,"Derivate usage when rendering into FBO");
      SVar1 = init::s_fboConfigs[(int)fboGroup].surfaceType;
      iVar2 = init::s_fboConfigs[(int)fboGroup].numSamples;
      tcu::TestNode::addChild(pTVar5,pTVar8);
      for (dataType_2 = TYPE_FLOAT; (int)dataType_2 < 5; dataType_2 = dataType_2 + TYPE_FLOAT) {
        for (precision_1 = PRECISION_LOWP; (int)precision_1 < 3;
            precision_1 = precision_1 + PRECISION_MEDIUMP) {
          if ((int)dataType_2 < 2) {
            local_85c = TYPE_FLOAT;
          }
          else {
            local_85c = glu::getDataTypeFloatVec(dataType_2);
          }
          caseName_1._372_4_ = 0x1100;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
          if ((SVar1 == SURFACETYPE_FLOAT_FBO) || (precision_1 != PRECISION_LOWP)) {
            pcVar6 = glu::getDataTypeName(local_85c);
            poVar10 = std::operator<<((ostream *)local_3d8,pcVar6);
            poVar10 = std::operator<<(poVar10,"_");
            pcVar6 = glu::getPrecisionName(precision_1);
            std::operator<<(poVar10,pcVar6);
            pLVar11 = (LinearDerivateCase *)operator_new(0x118);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            LinearDerivateCase::LinearDerivateCase
                      (pLVar11,pCVar4,pcVar6,"",functionGroup._4_4_,local_85c,precision_1,0x1100,
                       SVar1,iVar2,
                       "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                      );
            tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
            std::__cxx11::string::~string((string *)&hintCaseNdx);
            local_204 = 0;
          }
          else {
            local_204 = 0x19;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
        }
      }
    }
    for (hintGroup._0_4_ = 0; (int)hintGroup < 2; hintGroup._0_4_ = (int)hintGroup + 1) {
      pTVar8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar8,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_hints[(int)hintGroup].name,"Shader derivate hints");
      dVar3 = init::s_hints[(int)hintGroup].hint;
      tcu::TestNode::addChild(pTVar5,pTVar8);
      for (fboGroup_1._0_4_ = 0; (int)fboGroup_1 < 3; fboGroup_1._0_4_ = (int)fboGroup_1 + 1) {
        pTVar9 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar9,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::s_hintFboConfigs[(int)fboGroup_1].name,"");
        SVar1 = init::s_hintFboConfigs[(int)fboGroup_1].surfaceType;
        iVar2 = init::s_hintFboConfigs[(int)fboGroup_1].numSamples;
        tcu::TestNode::addChild(pTVar8,pTVar9);
        for (dataType_3 = TYPE_FLOAT; (int)dataType_3 < 5; dataType_3 = dataType_3 + TYPE_FLOAT) {
          for (precision_2 = PRECISION_LOWP; (int)precision_2 < 3;
              precision_2 = precision_2 + PRECISION_MEDIUMP) {
            if ((int)dataType_3 < 2) {
              local_8ac = TYPE_FLOAT;
            }
            else {
              local_8ac = glu::getDataTypeFloatVec(dataType_3);
            }
            caseName_2._372_4_ = local_8ac;
            caseName_2._368_4_ = precision_2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
            if ((SVar1 == SURFACETYPE_FLOAT_FBO) || (caseName_2._368_4_ != 0)) {
              pcVar6 = glu::getDataTypeName(caseName_2._372_4_);
              poVar10 = std::operator<<((ostream *)local_5b0,pcVar6);
              poVar10 = std::operator<<(poVar10,"_");
              pcVar6 = glu::getPrecisionName(caseName_2._368_4_);
              std::operator<<(poVar10,pcVar6);
              pLVar11 = (LinearDerivateCase *)operator_new(0x118);
              pCVar4 = (this->super_TestCaseGroup).m_context;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              LinearDerivateCase::LinearDerivateCase
                        (pLVar11,pCVar4,pcVar6,"",functionGroup._4_4_,caseName_2._372_4_,
                         caseName_2._368_4_,dVar3,SVar1,iVar2,
                         "#version 300 es\nin ${PRECISION} ${DATATYPE} v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
                        );
              tcu::TestNode::addChild(pTVar9,(TestNode *)pLVar11);
              std::__cxx11::string::~string(local_5d0);
              local_204 = 0;
            }
            else {
              local_204 = 0x25;
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          }
        }
      }
    }
    pTVar8 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar8,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texture",
               "Derivate of texture lookup result");
    tcu::TestNode::addChild(pTVar5,pTVar8);
    for (caseGroup._4_4_ = 0; caseGroup._4_4_ < 4; caseGroup._4_4_ = caseGroup._4_4_ + 1) {
      pTVar5 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar5,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::s_textureConfigs[caseGroup._4_4_].name,"");
      SVar1 = init::s_textureConfigs[caseGroup._4_4_].surfaceType;
      iVar2 = init::s_textureConfigs[caseGroup._4_4_].numSamples;
      dVar3 = init::s_textureConfigs[caseGroup._4_4_].hint;
      tcu::TestNode::addChild(pTVar8,pTVar5);
      for (dataType_4 = TYPE_FLOAT; (int)dataType_4 < 5; dataType_4 = dataType_4 + TYPE_FLOAT) {
        for (precision_3 = PRECISION_LOWP; (int)precision_3 < 3;
            precision_3 = precision_3 + PRECISION_MEDIUMP) {
          if ((int)dataType_4 < 2) {
            local_8fc = TYPE_FLOAT;
          }
          else {
            local_8fc = glu::getDataTypeFloatVec(dataType_4);
          }
          caseName_3._372_4_ = precision_3;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
          if ((SVar1 == SURFACETYPE_FLOAT_FBO) || (caseName_3._372_4_ != 0)) {
            pcVar6 = glu::getDataTypeName(local_8fc);
            poVar10 = std::operator<<((ostream *)local_788,pcVar6);
            poVar10 = std::operator<<(poVar10,"_");
            pcVar6 = glu::getPrecisionName(caseName_3._372_4_);
            std::operator<<(poVar10,pcVar6);
            this_00 = (TextureDerivateCase *)operator_new(0x120);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            TextureDerivateCase::TextureDerivateCase
                      (this_00,pCVar4,pcVar6,"",functionGroup._4_4_,local_8fc,caseName_3._372_4_,
                       dVar3,SVar1,iVar2);
            tcu::TestNode::addChild(pTVar5,(TestNode *)this_00);
            std::__cxx11::string::~string(local_7a8);
            local_204 = 0;
          }
          else {
            local_204 = 0x2e;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
        }
      }
    }
    functionGroup._4_4_ = functionGroup._4_4_ + DERIVATE_DFDY;
    pSVar12 = (ShaderDerivateTests *)(ulong)functionGroup._4_4_;
  }
  return (int)pSVar12;
}

Assistant:

void ShaderDerivateTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		description;
		const char*		source;
	} s_linearDerivateCases[] =
	{
		{
			"linear",
			"Basic derivate of linearly interpolated argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"in_function",
			"Derivate of linear function argument",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"\n"
			"${PRECISION} ${DATATYPE} computeRes (${PRECISION} ${DATATYPE} value)\n"
			"{\n"
			"	return ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"}\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = computeRes(v_coord);\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_if",
			"Derivate of linearly interpolated value in static if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (false)\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_loop",
			"Derivate of linearly interpolated value in static loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < 2; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"static_switch",
			"Derivate of linearly interpolated value in static switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (1)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_if",
			"Derivate of linearly interpolated value in uniform if",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform bool ub_true;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	if (ub_true)"
			"		res = ${FUNC}(v_coord) * u_scale + u_bias;\n"
			"	else\n"
			"		res = ${FUNC}(-v_coord) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_loop",
			"Derivate of linearly interpolated value in uniform loop",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_two;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res = ${DATATYPE}(0.0);\n"
			"	for (int i = 0; i < ui_two; i++)\n"
			"		res += ${FUNC}(v_coord * float(i));\n"
			"	res = res * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
		{
			"uniform_switch",
			"Derivate of linearly interpolated value in uniform switch",

			"#version 300 es\n"
			"in ${PRECISION} ${DATATYPE} v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"uniform int ui_one;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} ${DATATYPE} res;\n"
			"	switch (ui_one)\n"
			"	{\n"
			"		case 0:	res = ${FUNC}(-v_coord) * u_scale + u_bias;	break;\n"
			"		case 1:	res = ${FUNC}(v_coord) * u_scale + u_bias;	break;\n"
			"	}\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n"
		},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_fboConfigs[] =
	{
		{ "fbo",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa2",	SURFACETYPE_UNORM_FBO,				2 },
		{ "fbo_msaa4",	SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",	SURFACETYPE_FLOAT_FBO,				0 },
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} s_hints[] =
	{
		{ "fastest",	GL_FASTEST	},
		{ "nicest",		GL_NICEST	},
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
	} s_hintFboConfigs[] =
	{
		{ "default",		SURFACETYPE_DEFAULT_FRAMEBUFFER,	0 },
		{ "fbo_msaa4",		SURFACETYPE_UNORM_FBO,				4 },
		{ "fbo_float",		SURFACETYPE_FLOAT_FBO,				0 }
	};

	static const struct
	{
		const char*		name;
		SurfaceType		surfaceType;
		int				numSamples;
		deUint32		hint;
	} s_textureConfigs[] =
	{
		{ "basic",			SURFACETYPE_DEFAULT_FRAMEBUFFER,	0,	GL_DONT_CARE	},
		{ "msaa4",			SURFACETYPE_UNORM_FBO,				4,	GL_DONT_CARE	},
		{ "float_fastest",	SURFACETYPE_FLOAT_FBO,				0,	GL_FASTEST		},
		{ "float_nicest",	SURFACETYPE_FLOAT_FBO,				0,	GL_NICEST		},
	};

	// .dfdx, .dfdy, .fwidth
	for (int funcNdx = 0; funcNdx < DERIVATE_LAST; funcNdx++)
	{
		const DerivateFunc			function		= DerivateFunc(funcNdx);
		tcu::TestCaseGroup* const	functionGroup	= new tcu::TestCaseGroup(m_testCtx, getDerivateFuncCaseName(function), getDerivateFuncName(function));
		addChild(functionGroup);

		// .constant - no precision variants, checks that derivate of constant arguments is 0
		{
			tcu::TestCaseGroup* const constantGroup = new tcu::TestCaseGroup(m_testCtx, "constant", "Derivate of constant argument");
			functionGroup->addChild(constantGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				const glu::DataType dataType = vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
				constantGroup->addChild(new ConstantDerivateCase(m_context, glu::getDataTypeName(dataType), "", function, dataType));
			}
		}

		// Cases based on LinearDerivateCase
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_linearDerivateCases); caseNdx++)
		{
			tcu::TestCaseGroup* const linearCaseGroup	= new tcu::TestCaseGroup(m_testCtx, s_linearDerivateCases[caseNdx].name, s_linearDerivateCases[caseNdx].description);
			const char*			source					= s_linearDerivateCases[caseNdx].source;
			functionGroup->addChild(linearCaseGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const SurfaceType		surfaceType		= SURFACETYPE_DEFAULT_FRAMEBUFFER;
					const int				numSamples		= 0;
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (caseNdx != 0 && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to default FB.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					linearCaseGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// Fbo cases
		for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_fboConfigs); caseNdx++)
		{
			tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_fboConfigs[caseNdx].name, "Derivate usage when rendering into FBO");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const SurfaceType			surfaceType		= s_fboConfigs[caseNdx].surfaceType;
			const int					numSamples		= s_fboConfigs[caseNdx].numSamples;
			functionGroup->addChild(fboGroup);

			for (int vecSize = 1; vecSize <= 4; vecSize++)
			{
				for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
				{
					const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
					const glu::Precision	precision		= glu::Precision(precNdx);
					const deUint32			hint			= GL_DONT_CARE;
					ostringstream			caseName;

					if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
						continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

					caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

					fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
				}
			}
		}

		// .fastest, .nicest
		for (int hintCaseNdx = 0; hintCaseNdx < DE_LENGTH_OF_ARRAY(s_hints); hintCaseNdx++)
		{
			tcu::TestCaseGroup* const	hintGroup		= new tcu::TestCaseGroup(m_testCtx, s_hints[hintCaseNdx].name, "Shader derivate hints");
			const char*					source			= s_linearDerivateCases[0].source; // use source from .linear group
			const deUint32				hint			= s_hints[hintCaseNdx].hint;
			functionGroup->addChild(hintGroup);

			for (int fboCaseNdx = 0; fboCaseNdx < DE_LENGTH_OF_ARRAY(s_hintFboConfigs); fboCaseNdx++)
			{
				tcu::TestCaseGroup*	const	fboGroup		= new tcu::TestCaseGroup(m_testCtx, s_hintFboConfigs[fboCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_hintFboConfigs[fboCaseNdx].surfaceType;
				const int					numSamples		= s_hintFboConfigs[fboCaseNdx].numSamples;
				hintGroup->addChild(fboGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						fboGroup->addChild(new LinearDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples, source));
					}
				}
			}
		}

		// .texture
		{
			tcu::TestCaseGroup* const textureGroup = new tcu::TestCaseGroup(m_testCtx, "texture", "Derivate of texture lookup result");
			functionGroup->addChild(textureGroup);

			for (int texCaseNdx = 0; texCaseNdx < DE_LENGTH_OF_ARRAY(s_textureConfigs); texCaseNdx++)
			{
				tcu::TestCaseGroup*	const	caseGroup		= new tcu::TestCaseGroup(m_testCtx, s_textureConfigs[texCaseNdx].name, "");
				const SurfaceType			surfaceType		= s_textureConfigs[texCaseNdx].surfaceType;
				const int					numSamples		= s_textureConfigs[texCaseNdx].numSamples;
				const deUint32				hint			= s_textureConfigs[texCaseNdx].hint;
				textureGroup->addChild(caseGroup);

				for (int vecSize = 1; vecSize <= 4; vecSize++)
				{
					for (int precNdx = 0; precNdx < glu::PRECISION_LAST; precNdx++)
					{
						const glu::DataType		dataType		= vecSize > 1 ? glu::getDataTypeFloatVec(vecSize) : glu::TYPE_FLOAT;
						const glu::Precision	precision		= glu::Precision(precNdx);
						ostringstream			caseName;

						if (surfaceType != SURFACETYPE_FLOAT_FBO && precision == glu::PRECISION_LOWP)
							continue; // Skip as lowp doesn't actually produce any bits when rendered to U8 RT.

						caseName << glu::getDataTypeName(dataType) << "_" << glu::getPrecisionName(precision);

						caseGroup->addChild(new TextureDerivateCase(m_context, caseName.str().c_str(), "", function, dataType, precision, hint, surfaceType, numSamples));
					}
				}
			}
		}
	}
}